

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_graph.h
# Opt level: O0

void __thiscall ListGraph::ListGraph(ListGraph *this,int node_count,int arc_count)

{
  undefined8 in_RDI;
  ArrayIDIDFunc *in_stack_ffffffffffffffe0;
  
  ArrayIDIDFunc::ArrayIDIDFunc(in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  ArrayIDIDFunc::ArrayIDIDFunc(in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return;
}

Assistant:

ListGraph(int node_count, int arc_count)
        : head(arc_count, node_count)
        , tail(arc_count, node_count)
    {
    }